

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O3

void wallet::wallet_crypto_tests::TestCrypter::TestEncrypt
               (CCrypter *crypt,span<const_unsigned_char,_18446744073709551615UL> plaintext,
               span<const_unsigned_char,_18446744073709551615UL> correct_ciphertext)

{
  pointer puVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  iterator it;
  pointer puVar3;
  long in_FS_OFFSET;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_58;
  long local_38;
  
  _Var2 = plaintext._M_extent._M_extent_value;
  puVar3 = plaintext._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = puVar3 + _Var2._M_extent_value;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,secure_allocator<unsigned_char>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::span<unsigned_char_const,18446744073709551615ul>>>
            ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_58,puVar3,puVar1);
  TestEncryptSingle(crypt,(CKeyingMaterial *)&local_58,correct_ciphertext);
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_58);
  for (; _Var2._M_extent_value != 0; _Var2._M_extent_value = _Var2._M_extent_value - 1) {
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,secure_allocator<unsigned_char>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::span<unsigned_char_const,18446744073709551615ul>>>
              ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_58,puVar3,puVar1);
    TestEncryptSingle(crypt,(CKeyingMaterial *)&local_58,
                      (span<const_unsigned_char,_18446744073709551615UL>)ZEXT816(0));
    std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_58);
    puVar3 = puVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestEncrypt(const CCrypter& crypt, const std::span<const unsigned char> plaintext,
                        const std::span<const unsigned char> correct_ciphertext = {})
{
    TestEncryptSingle(crypt, CKeyingMaterial{plaintext.begin(), plaintext.end()}, correct_ciphertext);
    for (auto it{plaintext.begin()}; it != plaintext.end(); ++it) {
        TestEncryptSingle(crypt, CKeyingMaterial{it, plaintext.end()});
    }
}